

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::passing::passing(passing *this,location *where_,text *expr_,text *decomposition_,bool zen)

{
  undefined8 *in_RDI;
  byte in_R8B;
  bool bVar1;
  location *in_stack_fffffffffffffdf8;
  location *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  allocator *paVar2;
  allocator local_1b9;
  string local_1b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  string local_170 [32];
  undefined4 in_stack_fffffffffffffeb0;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  allocator in_stack_fffffffffffffeb7;
  text *in_stack_fffffffffffffeb8;
  location *in_stack_fffffffffffffec0;
  text *in_stack_fffffffffffffec8;
  success *in_stack_fffffffffffffed0;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [95];
  allocator local_69;
  string local_68 [32];
  string local_48 [39];
  byte local_21;
  
  local_21 = in_R8B & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"passed",&local_69);
  std::__cxx11::string::string(local_48,local_68);
  location::location(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  bVar5 = 0;
  bVar4 = 0;
  bVar3 = 0;
  bVar1 = (local_21 & 1) == 0;
  if (bVar1) {
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::__cxx11::string::string(local_108,local_170);
  }
  else {
    std::allocator<char>::allocator();
    bVar5 = 1;
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffeb8,"",(allocator *)&stack0xfffffffffffffeb7);
    bVar4 = 1;
    std::__cxx11::string::string(local_128,(string *)&stack0xfffffffffffffeb8);
    bVar3 = 1;
    std::__cxx11::string::string(local_108,local_128);
  }
  std::operator+(in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->file);
  std::__cxx11::string::string(local_c8,local_e8);
  paVar2 = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"",paVar2);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe68,local_1b8);
  success::success(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,
                   (text *)CONCAT17(in_stack_fffffffffffffeb7,
                                    CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(bVar3,
                                                  in_stack_fffffffffffffeb0)))));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  if (bVar1) {
    std::__cxx11::string::~string(local_170);
  }
  if ((bVar3 & 1) != 0) {
    std::__cxx11::string::~string(local_128);
  }
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  }
  if ((bVar5 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
  }
  location::~location((location *)0x12e224);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  *in_RDI = &PTR__passing_0013cca0;
  return;
}

Assistant:

passing( location where_, text expr_, text decomposition_, bool zen )
    : success( "passed", where_, expr_ + (zen ? "":" for " + decomposition_) ) {}